

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_variance_sse2.c
# Opt level: O1

uint64_t aom_mse_wxh_16bit_highbd_sse2
                   (uint16_t *dst,int dstride,uint16_t *src,int sstride,int w,int h)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  ulong uVar11;
  long lVar12;
  short sVar15;
  ushort uVar16;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  if (w == 8) {
    if (0 < h) {
      uVar11 = (ulong)(uint)h;
      lVar12 = 0;
      lVar17 = 0;
      do {
        sVar15 = src[3] - dst[3];
        auVar10._2_2_ = src[4] - dst[4];
        auVar10._0_2_ = sVar15;
        auVar10._4_8_ = 0;
        auVar6._12_2_ = sVar15;
        auVar6._0_12_ = auVar10 << 0x30;
        auVar8._6_8_ = 0;
        auVar8._0_6_ = (uint6)(CONCAT44(auVar6._10_4_,CONCAT22(src[2] - dst[2],sVar15)) >> 0x10);
        auVar19._6_8_ = SUB148(auVar8 << 0x40,6);
        auVar19._4_2_ = src[1] - dst[1];
        auVar19._2_2_ = 0;
        auVar19._0_2_ = *src - *dst;
        auVar19._14_2_ = 0;
        auVar14._2_2_ = 0;
        auVar14._0_2_ = src[4] - dst[4];
        auVar14._4_2_ = src[5] - dst[5];
        auVar14._6_2_ = 0;
        auVar14._8_2_ = src[6] - dst[6];
        auVar14._10_2_ = 0;
        auVar14._12_2_ = src[7] - dst[7];
        auVar14._14_2_ = 0;
        auVar19 = pmaddwd(auVar19,auVar19);
        auVar14 = pmaddwd(auVar14,auVar14);
        lVar12 = (ulong)auVar14._8_4_ +
                 (auVar14._0_8_ & 0xffffffff) + (auVar19._0_8_ & 0xffffffff) +
                 (ulong)auVar19._8_4_ + lVar12;
        lVar17 = (ulong)auVar14._12_4_ +
                 (ulong)auVar14._4_4_ + (ulong)auVar19._4_4_ + (ulong)auVar19._12_4_ + lVar17;
        src = src + sstride;
        dst = dst + dstride;
        uVar11 = uVar11 - 1;
      } while (uVar11 != 0);
      goto LAB_00325b1c;
    }
  }
  else {
    if (w != 4) {
      return 0xffffffffffffffff;
    }
    if (0 < h) {
      uVar11 = 0;
      lVar12 = 0;
      lVar17 = 0;
      do {
        uVar1 = *(undefined8 *)(dst + dstride);
        uVar2 = *(undefined8 *)dst;
        uVar3 = *(undefined8 *)(src + sstride);
        uVar4 = *(undefined8 *)src;
        sVar15 = (short)((ulong)uVar4 >> 0x30) - (short)((ulong)uVar2 >> 0x30);
        uVar16 = (short)uVar3 - (short)uVar1;
        auVar9._2_2_ = uVar16;
        auVar9._0_2_ = sVar15;
        auVar9._4_8_ = 0;
        auVar5._12_2_ = sVar15;
        auVar5._0_12_ = auVar9 << 0x30;
        auVar7._6_8_ = 0;
        auVar7._0_6_ = (uint6)(CONCAT44(auVar5._10_4_,
                                        CONCAT22((short)((ulong)uVar4 >> 0x20) -
                                                 (short)((ulong)uVar2 >> 0x20),sVar15)) >> 0x10);
        auVar18._6_8_ = SUB148(auVar7 << 0x40,6);
        auVar18._4_2_ = (short)((ulong)uVar4 >> 0x10) - (short)((ulong)uVar2 >> 0x10);
        auVar18._2_2_ = 0;
        auVar18._0_2_ = (short)uVar4 - (short)uVar2;
        auVar18._14_2_ = 0;
        auVar13._2_2_ = 0;
        auVar13._0_2_ = uVar16;
        auVar13._4_2_ = (short)((ulong)uVar3 >> 0x10) - (short)((ulong)uVar1 >> 0x10);
        auVar13._6_2_ = 0;
        auVar13._8_2_ = (short)((ulong)uVar3 >> 0x20) - (short)((ulong)uVar1 >> 0x20);
        auVar13._10_2_ = 0;
        auVar13._12_2_ = (short)((ulong)uVar3 >> 0x30) - (short)((ulong)uVar1 >> 0x30);
        auVar13._14_2_ = 0;
        auVar19 = pmaddwd(auVar18,auVar18);
        auVar14 = pmaddwd(auVar13,auVar13);
        lVar12 = (ulong)auVar14._8_4_ +
                 (auVar14._0_8_ & 0xffffffff) + (auVar19._0_8_ & 0xffffffff) +
                 (ulong)auVar19._8_4_ + lVar12;
        lVar17 = (ulong)auVar14._12_4_ +
                 (ulong)auVar14._4_4_ + (ulong)auVar19._4_4_ + (ulong)auVar19._12_4_ + lVar17;
        uVar11 = uVar11 + 2;
        src = src + (long)sstride * 2;
        dst = dst + (long)dstride * 2;
      } while (uVar11 < (uint)h);
      goto LAB_00325b1c;
    }
  }
  lVar12 = 0;
  lVar17 = 0;
LAB_00325b1c:
  return lVar17 + lVar12;
}

Assistant:

uint64_t aom_mse_wxh_16bit_highbd_sse2(uint16_t *dst, int dstride,
                                       uint16_t *src, int sstride, int w,
                                       int h) {
  assert((w == 8 || w == 4) && (h == 8 || h == 4) &&
         "w=8/4 and h=8/4 must satisfy");
  switch (w) {
    case 4: return mse_4xh_16bit_highbd_sse2(dst, dstride, src, sstride, h);
    case 8: return mse_8xh_16bit_highbd_sse2(dst, dstride, src, sstride, h);
    default: assert(0 && "unsupported width"); return -1;
  }
}